

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O0

bool __thiscall
cmExportCommand::InitialPass
          (cmExportCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  TargetType TVar2;
  size_type sVar3;
  const_reference pvVar4;
  ulong uVar5;
  string *psVar6;
  cmGlobalGenerator *this_00;
  cmExportSet *pcVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  reference name;
  ostream *poVar8;
  cmExportBuildFileGenerator *pcVar9;
  char *pcVar10;
  reference config;
  string *ct;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_e18 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  string local_df8;
  cmExportBuildFileGenerator *local_dd8;
  cmExportBuildFileGenerator *ebfg;
  string local_dc8;
  cmExportBuildFileGenerator *local_da8;
  cmExportBuildFileGenerator *ebfg_1;
  undefined1 local_d80 [8];
  ostringstream e_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_be8;
  cmTarget *local_bc8;
  cmTarget *target;
  undefined1 local_ba0 [8];
  ostringstream e_5;
  string *currentTarget;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  undefined1 local_9e8 [8];
  ostringstream e_4;
  _Self local_870;
  _Self local_868;
  undefined1 local_860 [8];
  string setName;
  cmExportSetMap *setMap;
  undefined1 local_818 [8];
  ostringstream e_3;
  string local_6a0;
  undefined1 local_680 [8];
  ostringstream e_2;
  cmGlobalGenerator *gg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  undefined1 local_4a8 [8];
  string dir;
  undefined1 local_468 [8];
  ostringstream e_1;
  string local_2f0;
  undefined1 local_2d0 [8];
  ostringstream e;
  allocator<char> local_151;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  allocator<char> local_e9;
  string local_e8;
  byte local_c1;
  undefined1 local_c0 [7];
  bool android;
  string fname;
  string local_98;
  undefined1 local_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmExportCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with too few arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
    goto LAB_0031c722;
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,0);
  bVar1 = std::operator==(pvVar4,"PACKAGE");
  if (bVar1) {
    this_local._7_1_ =
         HandlePackage(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local);
    goto LAB_0031c722;
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,0);
  bVar1 = std::operator==(pvVar4,"EXPORT");
  if (bVar1) {
    cmCommandArgument::Follows
              (&(this->ExportSetName).super_cmCommandArgument,(cmCommandArgument *)0x0);
    cmCommandArgumentGroup::Follows
              (&this->ArgumentGroup,&(this->ExportSetName).super_cmCommandArgument);
  }
  else {
    cmCommandArgument::Follows(&(this->Targets).super_cmCommandArgument,(cmCommandArgument *)0x0);
    cmCommandArgumentGroup::Follows(&this->ArgumentGroup,&(this->Targets).super_cmCommandArgument);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_78);
  cmCommandArgumentsHelper::Parse
            (&this->Helper,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)param_2_local,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_78);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_78);
  if (bVar1) {
    std::__cxx11::string::string((string *)local_c0);
    local_c1 = 0;
    bVar1 = cmCommandArgument::WasFound(&(this->AndroidMKFile).super_cmCommandArgument);
    if (bVar1) {
      psVar6 = cmCAString::GetString_abi_cxx11_(&this->AndroidMKFile);
      std::__cxx11::string::operator=((string *)local_c0,(string *)psVar6);
      local_c1 = 1;
    }
    bVar1 = cmCommandArgument::WasFound(&(this->Filename).super_cmCommandArgument);
    if ((bVar1) || (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) != 0) {
        pcVar10 = cmCAString::GetCString(&this->Filename);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,pcVar10,&local_151);
        cmsys::SystemTools::GetFilenameLastExtension(&local_130,&local_150);
        bVar1 = std::operator!=(&local_130,".cmake");
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_150);
        std::allocator<char>::~allocator(&local_151);
        if (bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d0);
          poVar8 = std::operator<<((ostream *)local_2d0,"FILE option given filename \"");
          psVar6 = cmCAString::GetString_abi_cxx11_(&this->Filename);
          poVar8 = std::operator<<(poVar8,(string *)psVar6);
          std::operator<<(poVar8,"\" which does not have an extension of \".cmake\".\n");
          std::__cxx11::ostringstream::str();
          cmCommand::SetError(&this->super_cmCommand,&local_2f0);
          std::__cxx11::string::~string((string *)&local_2f0);
          this_local._7_1_ = 0;
          fname.field_2._8_4_ = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d0);
          goto LAB_0031c6f0;
        }
        psVar6 = cmCAString::GetString_abi_cxx11_(&this->Filename);
        std::__cxx11::string::operator=((string *)local_c0,(string *)psVar6);
      }
LAB_0031b793:
      bVar1 = cmsys::SystemTools::FileIsFullPath((string *)local_c0);
      if (bVar1) {
        bVar1 = cmMakefile::CanIWriteThisFile((this->super_cmCommand).Makefile,(string *)local_c0);
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
          poVar8 = std::operator<<((ostream *)local_468,"FILE option given filename \"");
          poVar8 = std::operator<<(poVar8,(string *)local_c0);
          std::operator<<(poVar8,"\" which is in the source tree.\n");
          std::__cxx11::ostringstream::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)((long)&dir.field_2 + 8));
          std::__cxx11::string::~string((string *)(dir.field_2._M_local_buf + 8));
          this_local._7_1_ = 0;
          fname.field_2._8_4_ = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
          goto LAB_0031c6f0;
        }
      }
      else {
        psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
        std::__cxx11::string::string((string *)local_4a8,(string *)psVar6);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &targets.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4a8,"/");
        std::operator+(&local_4c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &targets.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                      );
        std::__cxx11::string::operator=((string *)local_c0,(string *)&local_4c8);
        std::__cxx11::string::~string((string *)&local_4c8);
        std::__cxx11::string::~string
                  ((string *)
                   &targets.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string((string *)local_4a8);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&gg);
      this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,0);
      bVar1 = std::operator==(pvVar4,"EXPORT");
      if (bVar1) {
        bVar1 = cmCAEnabler::IsEnabled(&this->Append);
        if (bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_680);
          std::operator<<((ostream *)local_680,
                          "EXPORT signature does not recognise the APPEND option.");
          std::__cxx11::ostringstream::str();
          cmCommand::SetError(&this->super_cmCommand,&local_6a0);
          std::__cxx11::string::~string((string *)&local_6a0);
          this_local._7_1_ = 0;
          fname.field_2._8_4_ = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_680);
        }
        else {
          bVar1 = cmCAEnabler::IsEnabled(&this->ExportOld);
          if (bVar1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_818);
            std::operator<<((ostream *)local_818,
                            "EXPORT signature does not recognise the EXPORT_LINK_INTERFACE_LIBRARIES option."
                           );
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)&setMap);
            std::__cxx11::string::~string((string *)&setMap);
            this_local._7_1_ = 0;
            fname.field_2._8_4_ = 1;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_818);
          }
          else {
            setName.field_2._8_8_ = cmGlobalGenerator::GetExportSets(this_00);
            psVar6 = cmCAString::GetString_abi_cxx11_(&this->ExportSetName);
            std::__cxx11::string::string((string *)local_860,(string *)psVar6);
            local_868._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                 ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                         *)setName.field_2._8_8_,(key_type *)local_860);
            local_870._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                        *)setName.field_2._8_8_);
            bVar1 = std::operator==(&local_868,&local_870);
            if (bVar1) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9e8);
              poVar8 = std::operator<<((ostream *)local_9e8,"Export set \"");
              poVar8 = std::operator<<(poVar8,(string *)local_860);
              std::operator<<(poVar8,"\" not found.");
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,(string *)&__range3);
              std::__cxx11::string::~string((string *)&__range3);
              this_local._7_1_ = 0;
              fname.field_2._8_4_ = 1;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9e8);
            }
            else {
              pcVar7 = cmExportSetMap::operator[]
                                 ((cmExportSetMap *)setName.field_2._8_8_,(string *)local_860);
              this->ExportSet = pcVar7;
              fname.field_2._8_4_ = 0;
            }
            std::__cxx11::string::~string((string *)local_860);
            if (fname.field_2._8_4_ == 0) goto LAB_0031c2ec;
          }
        }
      }
      else {
        bVar1 = cmCommandArgument::WasFound(&(this->Targets).super_cmCommandArgument);
        if (bVar1) {
          this_01 = cmCAStringVector::GetVector_abi_cxx11_(&this->Targets);
          __end3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(this_01);
          currentTarget =
               (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(this_01);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&currentTarget), bVar1) {
            name = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end3);
            bVar1 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,name);
            if (bVar1) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ba0);
              poVar8 = std::operator<<((ostream *)local_ba0,"given ALIAS target \"");
              poVar8 = std::operator<<(poVar8,(string *)name);
              std::operator<<(poVar8,"\" which may not be exported.");
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,(string *)&target);
              std::__cxx11::string::~string((string *)&target);
              this_local._7_1_ = 0;
              fname.field_2._8_4_ = 1;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ba0);
              goto LAB_0031c6d4;
            }
            local_bc8 = cmGlobalGenerator::FindTarget(this_00,name,false);
            if (local_bc8 == (cmTarget *)0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d80);
              poVar8 = std::operator<<((ostream *)local_d80,"given target \"");
              poVar8 = std::operator<<(poVar8,(string *)name);
              std::operator<<(poVar8,"\" which is not built by this project.");
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,(string *)&ebfg_1);
              std::__cxx11::string::~string((string *)&ebfg_1);
              this_local._7_1_ = 0;
              fname.field_2._8_4_ = 1;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d80);
              goto LAB_0031c6d4;
            }
            TVar2 = cmTarget::GetType(local_bc8);
            if (TVar2 == UTILITY) {
              std::operator+(&local_c08,"given custom target \"",name);
              std::operator+(&local_be8,&local_c08,"\" which may not be exported.");
              cmCommand::SetError(&this->super_cmCommand,&local_be8);
              std::__cxx11::string::~string((string *)&local_be8);
              std::__cxx11::string::~string((string *)&local_c08);
              this_local._7_1_ = 0;
              fname.field_2._8_4_ = 1;
              goto LAB_0031c6d4;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gg,name);
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end3);
          }
          bVar1 = cmCAEnabler::IsEnabled(&this->Append);
          if ((bVar1) &&
             (local_da8 = cmGlobalGenerator::GetExportedTargetsFile(this_00,(string *)local_c0),
             local_da8 != (cmExportBuildFileGenerator *)0x0)) {
            cmExportBuildFileGenerator::AppendTargets
                      (local_da8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&gg);
            this_local._7_1_ = 1;
            fname.field_2._8_4_ = 1;
          }
          else {
LAB_0031c2ec:
            local_dd8 = (cmExportBuildFileGenerator *)0x0;
            if ((local_c1 & 1) == 0) {
              pcVar9 = (cmExportBuildFileGenerator *)operator_new(0x140);
              cmExportBuildFileGenerator::cmExportBuildFileGenerator(pcVar9);
              local_dd8 = pcVar9;
            }
            else {
              pcVar9 = (cmExportBuildFileGenerator *)operator_new(0x140);
              cmExportBuildAndroidMKGenerator::cmExportBuildAndroidMKGenerator
                        ((cmExportBuildAndroidMKGenerator *)pcVar9);
              local_dd8 = pcVar9;
            }
            pcVar9 = local_dd8;
            pcVar10 = (char *)std::__cxx11::string::c_str();
            cmExportFileGenerator::SetExportFile(&pcVar9->super_cmExportFileGenerator,pcVar10);
            pcVar9 = local_dd8;
            pcVar10 = cmCAString::GetCString(&this->Namespace);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_df8,pcVar10,
                       (allocator<char> *)
                       ((long)&configurationTypes.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            cmExportFileGenerator::SetNamespace(&pcVar9->super_cmExportFileGenerator,&local_df8);
            std::__cxx11::string::~string((string *)&local_df8);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&configurationTypes.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            pcVar9 = local_dd8;
            bVar1 = cmCAEnabler::IsEnabled(&this->Append);
            cmExportBuildFileGenerator::SetAppendMode(pcVar9,bVar1);
            if (this->ExportSet == (cmExportSet *)0x0) {
              cmExportBuildFileGenerator::SetTargets
                        (local_dd8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&gg);
            }
            else {
              cmExportBuildFileGenerator::SetExportSet(local_dd8,this->ExportSet);
            }
            cmMakefile::AddExportBuildFileGenerator((this->super_cmCommand).Makefile,local_dd8);
            pcVar9 = local_dd8;
            bVar1 = cmCAEnabler::IsEnabled(&this->ExportOld);
            cmExportFileGenerator::SetExportOld(&pcVar9->super_cmExportFileGenerator,bVar1);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_e18);
            cmMakefile::GetConfigurations
                      ((string *)&__range1,(this->super_cmCommand).Makefile,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_e18,true);
            std::__cxx11::string::~string((string *)&__range1);
            bVar1 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_e18);
            if (bVar1) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_e18);
            }
            __end1 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_e18);
            ct = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_e18);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&ct), bVar1) {
              config = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&__end1);
              cmExportFileGenerator::AddConfiguration
                        (&local_dd8->super_cmExportFileGenerator,config);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end1);
            }
            if (this->ExportSet == (cmExportSet *)0x0) {
              cmGlobalGenerator::AddBuildExportSet(this_00,local_dd8);
            }
            else {
              cmGlobalGenerator::AddBuildExportExportSet(this_00,local_dd8);
            }
            this_local._7_1_ = 1;
            fname.field_2._8_4_ = 1;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_e18);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_dc8,"EXPORT or TARGETS specifier missing.",
                     (allocator<char> *)((long)&ebfg + 7));
          cmCommand::SetError(&this->super_cmCommand,&local_dc8);
          std::__cxx11::string::~string((string *)&local_dc8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&ebfg + 7));
          this_local._7_1_ = 0;
          fname.field_2._8_4_ = 1;
        }
      }
LAB_0031c6d4:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gg);
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,0);
      bVar1 = std::operator!=(pvVar4,"EXPORT");
      if (!bVar1) {
        psVar6 = cmCAString::GetString_abi_cxx11_(&this->ExportSetName);
        std::operator+(&local_110,psVar6,".cmake");
        std::__cxx11::string::operator=((string *)local_c0,(string *)&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        goto LAB_0031b793;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"FILE <filename> option missing.",&local_e9);
      cmCommand::SetError(&this->super_cmCommand,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
      this_local._7_1_ = 0;
      fname.field_2._8_4_ = 1;
    }
LAB_0031c6f0:
    std::__cxx11::string::~string((string *)local_c0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"Unknown arguments.",
               (allocator<char> *)(fname.field_2._M_local_buf + 0xf));
    cmCommand::SetError(&this->super_cmCommand,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)(fname.field_2._M_local_buf + 0xf));
    this_local._7_1_ = 0;
    fname.field_2._8_4_ = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
LAB_0031c722:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmExportCommand::InitialPass(std::vector<std::string> const& args,
                                  cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with too few arguments");
    return false;
  }

  if (args[0] == "PACKAGE") {
    return this->HandlePackage(args);
  }
  if (args[0] == "EXPORT") {
    this->ExportSetName.Follows(nullptr);
    this->ArgumentGroup.Follows(&this->ExportSetName);
  } else {
    this->Targets.Follows(nullptr);
    this->ArgumentGroup.Follows(&this->Targets);
  }

  std::vector<std::string> unknownArgs;
  this->Helper.Parse(&args, &unknownArgs);

  if (!unknownArgs.empty()) {
    this->SetError("Unknown arguments.");
    return false;
  }

  std::string fname;
  bool android = false;
  if (this->AndroidMKFile.WasFound()) {
    fname = this->AndroidMKFile.GetString();
    android = true;
  }
  if (!this->Filename.WasFound() && fname.empty()) {
    if (args[0] != "EXPORT") {
      this->SetError("FILE <filename> option missing.");
      return false;
    }
    fname = this->ExportSetName.GetString() + ".cmake";
  } else if (fname.empty()) {
    // Make sure the file has a .cmake extension.
    if (cmSystemTools::GetFilenameLastExtension(this->Filename.GetCString()) !=
        ".cmake") {
      std::ostringstream e;
      e << "FILE option given filename \"" << this->Filename.GetString()
        << "\" which does not have an extension of \".cmake\".\n";
      this->SetError(e.str());
      return false;
    }
    fname = this->Filename.GetString();
  }

  // Get the file to write.
  if (cmSystemTools::FileIsFullPath(fname)) {
    if (!this->Makefile->CanIWriteThisFile(fname)) {
      std::ostringstream e;
      e << "FILE option given filename \"" << fname
        << "\" which is in the source tree.\n";
      this->SetError(e.str());
      return false;
    }
  } else {
    // Interpret relative paths with respect to the current build dir.
    std::string dir = this->Makefile->GetCurrentBinaryDirectory();
    fname = dir + "/" + fname;
  }

  std::vector<std::string> targets;

  cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();

  if (args[0] == "EXPORT") {
    if (this->Append.IsEnabled()) {
      std::ostringstream e;
      e << "EXPORT signature does not recognise the APPEND option.";
      this->SetError(e.str());
      return false;
    }

    if (this->ExportOld.IsEnabled()) {
      std::ostringstream e;
      e << "EXPORT signature does not recognise the "
           "EXPORT_LINK_INTERFACE_LIBRARIES option.";
      this->SetError(e.str());
      return false;
    }

    cmExportSetMap& setMap = gg->GetExportSets();
    std::string setName = this->ExportSetName.GetString();
    if (setMap.find(setName) == setMap.end()) {
      std::ostringstream e;
      e << "Export set \"" << setName << "\" not found.";
      this->SetError(e.str());
      return false;
    }
    this->ExportSet = setMap[setName];
  } else if (this->Targets.WasFound()) {
    for (std::string const& currentTarget : this->Targets.GetVector()) {
      if (this->Makefile->IsAlias(currentTarget)) {
        std::ostringstream e;
        e << "given ALIAS target \"" << currentTarget
          << "\" which may not be exported.";
        this->SetError(e.str());
        return false;
      }

      if (cmTarget* target = gg->FindTarget(currentTarget)) {
        if (target->GetType() == cmStateEnums::UTILITY) {
          this->SetError("given custom target \"" + currentTarget +
                         "\" which may not be exported.");
          return false;
        }
      } else {
        std::ostringstream e;
        e << "given target \"" << currentTarget
          << "\" which is not built by this project.";
        this->SetError(e.str());
        return false;
      }
      targets.push_back(currentTarget);
    }
    if (this->Append.IsEnabled()) {
      if (cmExportBuildFileGenerator* ebfg =
            gg->GetExportedTargetsFile(fname)) {
        ebfg->AppendTargets(targets);
        return true;
      }
    }
  } else {
    this->SetError("EXPORT or TARGETS specifier missing.");
    return false;
  }

  // Setup export file generation.
  cmExportBuildFileGenerator* ebfg = nullptr;
  if (android) {
    ebfg = new cmExportBuildAndroidMKGenerator;
  } else {
    ebfg = new cmExportBuildFileGenerator;
  }
  ebfg->SetExportFile(fname.c_str());
  ebfg->SetNamespace(this->Namespace.GetCString());
  ebfg->SetAppendMode(this->Append.IsEnabled());
  if (this->ExportSet) {
    ebfg->SetExportSet(this->ExportSet);
  } else {
    ebfg->SetTargets(targets);
  }
  this->Makefile->AddExportBuildFileGenerator(ebfg);
  ebfg->SetExportOld(this->ExportOld.IsEnabled());

  // Compute the set of configurations exported.
  std::vector<std::string> configurationTypes;
  this->Makefile->GetConfigurations(configurationTypes);
  if (configurationTypes.empty()) {
    configurationTypes.emplace_back();
  }
  for (std::string const& ct : configurationTypes) {
    ebfg->AddConfiguration(ct);
  }
  if (this->ExportSet) {
    gg->AddBuildExportExportSet(ebfg);
  } else {
    gg->AddBuildExportSet(ebfg);
  }

  return true;
}